

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_4,_13>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 *puVar1;
  int col;
  long lVar2;
  undefined4 *puVar3;
  long lVar4;
  long lVar5;
  float v;
  float fVar6;
  undefined4 uVar7;
  undefined8 local_98;
  float afStack_90 [2];
  undefined8 local_88;
  Vector<float,_4> res;
  int aiStack_60 [6];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    res.m_data[2] = (evalCtx->coords).m_data[0];
    res.m_data[3] = (evalCtx->coords).m_data[1];
  }
  else {
    res.m_data[2] = (float)0x3fb33333;
    res.m_data[3] = (float)0x3e4ccccd;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    puVar1 = &local_48;
    lVar2 = 0;
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        uVar7 = 0x3f800000;
        if (lVar2 != lVar5) {
          uVar7 = 0;
        }
        *(undefined4 *)((long)puVar1 + lVar5) = uVar7;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x40);
      lVar4 = lVar4 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      lVar2 = lVar2 + 0x10;
    } while (lVar4 != 4);
    local_48 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_40 = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_38 = *(undefined8 *)evalCtx->in[1].m_data;
    uStack_30 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_28 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_20 = *(undefined8 *)(evalCtx->in[2].m_data + 2);
    local_18 = *(undefined8 *)evalCtx->in[3].m_data;
    uStack_10 = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  }
  else {
    puVar1 = &local_48;
    local_18 = 0;
    uStack_10 = 0;
    local_28 = 0;
    uStack_20 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    puVar3 = &DAT_01bf46d0;
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        *(undefined4 *)((long)puVar1 + lVar4 * 4) = *(undefined4 *)((long)puVar3 + lVar4);
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x10);
      lVar2 = lVar2 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar3 = puVar3 + 4;
    } while (lVar2 != 4);
  }
  local_98 = 0;
  afStack_90[0] = 0.0;
  afStack_90[1] = 0.0;
  puVar1 = &local_48;
  lVar2 = 0;
  do {
    fVar6 = 0.0;
    lVar4 = 0;
    do {
      fVar6 = fVar6 + *(float *)((long)puVar1 + lVar4 * 4) * res.m_data[lVar4 + 2];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    *(float *)((long)&local_98 + lVar2 * 4) = fVar6;
    lVar2 = lVar2 + 1;
    puVar1 = puVar1 + 2;
  } while (lVar2 != 4);
  local_88 = local_98;
  res.m_data[0] = afStack_90[0] + afStack_90[1];
  aiStack_60[2] = 0;
  aiStack_60[3] = 1;
  aiStack_60[4] = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[aiStack_60[lVar2]] = afStack_90[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}